

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O1

void __thiscall
kainjow::mustache::
parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
parse_tag_contents(parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *this,bool is_unescaped_var,
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *contents,
                  mstch_tag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *tag)

{
  byte bVar1;
  size_type sVar2;
  byte *pbVar3;
  tag_type tVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  undefined7 in_register_00000031;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  long *local_58 [2];
  long local_48 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((int)CONCAT71(in_register_00000031,is_unescaped_var) == 0) {
    sVar2 = contents->_M_string_length;
    if (sVar2 == 0) {
      tag->type = variable;
      (tag->name)._M_string_length = 0;
      *(tag->name)._M_dataplus._M_p = '\0';
      return;
    }
    pbVar3 = (byte *)(contents->_M_dataplus)._M_p;
    bVar1 = *pbVar3;
    if (bVar1 < 0x2f) {
      if (bVar1 == 0x21) {
        tVar4 = comment;
LAB_001de220:
        tag->type = tVar4;
        local_58[0] = local_48;
        std::__cxx11::string::_M_construct<char*>((string *)local_58,pbVar3,pbVar3 + sVar2);
        std::__cxx11::string::_M_erase((ulong)local_58,0);
        trim<std::__cxx11::string>(&local_38,(mustache *)local_58,s);
        std::__cxx11::string::operator=((string *)tag,(string *)&local_38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
        if (local_58[0] != local_48) {
          operator_delete(local_58[0],local_48[0] + 1);
        }
        return;
      }
      if (bVar1 == 0x23) {
        tVar4 = section_begin;
        goto LAB_001de220;
      }
      if (bVar1 == 0x26) {
        tVar4 = unescaped_variable;
        goto LAB_001de220;
      }
    }
    else {
      if (bVar1 == 0x2f) {
        tVar4 = section_end;
        goto LAB_001de220;
      }
      if (bVar1 == 0x3e) {
        tVar4 = partial;
        goto LAB_001de220;
      }
      if (bVar1 == 0x5e) {
        tVar4 = section_begin_inverted;
        goto LAB_001de220;
      }
    }
    tag->type = variable;
  }
  else {
    tag->type = unescaped_variable;
  }
  std::__cxx11::string::_M_assign((string *)tag);
  return;
}

Assistant:

void parse_tag_contents(bool is_unescaped_var, const string_type& contents, mstch_tag<string_type>& tag) const {
        if (is_unescaped_var) {
            tag.type = tag_type::unescaped_variable;
            tag.name = contents;
        } else if (contents.empty()) {
            tag.type = tag_type::variable;
            tag.name.clear();
        } else {
            switch (contents.at(0)) {
                case '#':
                    tag.type = tag_type::section_begin;
                    break;
                case '^':
                    tag.type = tag_type::section_begin_inverted;
                    break;
                case '/':
                    tag.type = tag_type::section_end;
                    break;
                case '>':
                    tag.type = tag_type::partial;
                    break;
                case '&':
                    tag.type = tag_type::unescaped_variable;
                    break;
                case '!':
                    tag.type = tag_type::comment;
                    break;
                default:
                    tag.type = tag_type::variable;
                    break;
            }
            if (tag.type == tag_type::variable) {
                tag.name = contents;
            } else {
                string_type name{contents};
                name.erase(name.begin());
                tag.name = trim(name);
            }
        }
    }